

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Type * __thiscall soul::heart::Parser::readValueOrRefType(Type *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  Type t;
  Parser *this_local;
  
  t.structure.object = (Structure *)this;
  readValueType((Type *)local_30,this);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d3e8d);
  if (bVar1) {
    Type::createReference(__return_storage_ptr__,(Type *)local_30);
  }
  else {
    Type::Type(__return_storage_ptr__,(Type *)local_30);
  }
  Type::~Type((Type *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Type readValueOrRefType()
    {
        auto t = readValueType();

        if (matchIf (HEARTOperator::bitwiseAnd))
            return t.createReference();

        return t;
    }